

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O2

duckdb_database * duckdb::ExtensionAccess::GetDatabase(duckdb_extension_info info)

{
  duckdb_extension_info this;
  unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_> __p;
  pointer this_00;
  _Head_base<0UL,_duckdb::DatabaseWrapper_*,_false> local_98;
  
  make_uniq<duckdb::DatabaseWrapper>();
  __p._M_t.
  super___uniq_ptr_impl<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DatabaseWrapper_*,_std::default_delete<duckdb::DatabaseWrapper>_>.
  super__Head_base<0UL,_duckdb::DatabaseWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>,_true,_true>
        )(__uniq_ptr_data<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>,_true,_true>
          )local_98._M_head_impl;
  this = info + 0x10;
  local_98._M_head_impl = (DatabaseWrapper *)0x0;
  ::std::__uniq_ptr_impl<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_>::
  reset((__uniq_ptr_impl<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_> *)
        this,(pointer)__p._M_t.
                      super___uniq_ptr_impl<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::DatabaseWrapper_*,_std::default_delete<duckdb::DatabaseWrapper>_>
                      .super__Head_base<0UL,_duckdb::DatabaseWrapper_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_>::
  ~unique_ptr((unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>_> *)
              &stack0xffffffffffffff68);
  make_shared_ptr<duckdb::DuckDB,duckdb::DatabaseInstance&>
            ((DatabaseInstance *)&stack0xffffffffffffff68);
  this_00 = unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>,_true>
            ::operator->((unique_ptr<duckdb::DatabaseWrapper,_std::default_delete<duckdb::DatabaseWrapper>,_true>
                          *)this);
  shared_ptr<duckdb::DuckDB,_true>::operator=
            (&this_00->database,(shared_ptr<duckdb::DuckDB,_true> *)&stack0xffffffffffffff68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff70);
  return (duckdb_database *)
         (_Tuple_impl<0UL,_duckdb::DatabaseWrapper_*,_std::default_delete<duckdb::DatabaseWrapper>_>
         )*(tuple<duckdb::DatabaseWrapper_*,_std::default_delete<duckdb::DatabaseWrapper>_> *)this;
}

Assistant:

static duckdb_database *GetDatabase(duckdb_extension_info info) {
		auto &load_state = DuckDBExtensionLoadState::Get(info);

		try {
			// Create the duckdb_database
			load_state.database_data = make_uniq<DatabaseWrapper>();
			load_state.database_data->database = make_shared_ptr<DuckDB>(load_state.db);
			return reinterpret_cast<duckdb_database *>(load_state.database_data.get());
		} catch (std::exception &ex) {
			load_state.has_error = true;
			load_state.error_data = ErrorData(ex);
			return nullptr;
		} catch (...) {
			load_state.has_error = true;
			load_state.error_data =
			    ErrorData(ExceptionType::UNKNOWN_TYPE, "Unknown error in GetDatabase when trying to load extension!");
			return nullptr;
		}
	}